

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O2

void __thiscall
sigslot::_signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::
~_signal_base2(_signal_base2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>
               *this)

{
  ~_signal_base2(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~_signal_base2()
		{
			disconnect_all();
		}